

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O2

vector<duckdb::MetadataBlockInfo,_true> * __thiscall
duckdb::MetadataManager::GetMetadataInfo
          (vector<duckdb::MetadataBlockInfo,_true> *__return_storage_ptr__,MetadataManager *this)

{
  _Hash_node_base *p_Var1;
  pointer pMVar2;
  pointer pMVar3;
  long lVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  __normal_iterator<duckdb::MetadataBlockInfo_*,_std::vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>_>
  __i;
  pointer pMVar7;
  __node_base *p_Var8;
  ulong local_60;
  MetadataBlockInfo block_info;
  
  (__return_storage_ptr__->
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
  super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var8 = &(this->blocks)._M_h._M_before_begin;
  while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    block_info.free_list.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    block_info.free_list.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    block_info.free_list.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    block_info.block_id = *(block_id_t *)(p_Var8 + 4);
    block_info.total_blocks = 0x40;
    p_Var1 = p_Var8[6]._M_nxt;
    for (p_Var6 = p_Var8[5]._M_nxt; p_Var6 != p_Var1;
        p_Var6 = (_Hash_node_base *)((long)&p_Var6->_M_nxt + 1)) {
      local_60 = (ulong)*(byte *)&p_Var6->_M_nxt;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&block_info.free_list,
                 &local_60);
    }
    ::std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (block_info.free_list.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               block_info.free_list.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    ::std::vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>::
    emplace_back<duckdb::MetadataBlockInfo>
              (&__return_storage_ptr__->
                super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>,
               &block_info);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&block_info.free_list)
    ;
  }
  pMVar2 = (__return_storage_ptr__->
           super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
           super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (__return_storage_ptr__->
           super_vector<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>).
           super__Vector_base<duckdb::MetadataBlockInfo,_std::allocator<duckdb::MetadataBlockInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar2 != pMVar3) {
    uVar5 = ((long)pMVar3 - (long)pMVar2) / 0x28;
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::MetadataBlockInfo*,std::vector<duckdb::MetadataBlockInfo,std::allocator<duckdb::MetadataBlockInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::MetadataManager::GetMetadataInfo()const::__0>>
              (pMVar2,pMVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pMVar3 - (long)pMVar2 < 0x281) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::MetadataBlockInfo*,std::vector<duckdb::MetadataBlockInfo,std::allocator<duckdb::MetadataBlockInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::MetadataManager::GetMetadataInfo()const::__0>>
                (pMVar2,pMVar3);
    }
    else {
      pMVar7 = pMVar2 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::MetadataBlockInfo*,std::vector<duckdb::MetadataBlockInfo,std::allocator<duckdb::MetadataBlockInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::MetadataManager::GetMetadataInfo()const::__0>>
                (pMVar2,pMVar7);
      for (; pMVar7 != pMVar3; pMVar7 = pMVar7 + 1) {
        ::std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<duckdb::MetadataBlockInfo*,std::vector<duckdb::MetadataBlockInfo,std::allocator<duckdb::MetadataBlockInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::MetadataManager::GetMetadataInfo()const::__0>>
                  (pMVar7);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<MetadataBlockInfo> MetadataManager::GetMetadataInfo() const {
	vector<MetadataBlockInfo> result;
	for (auto &block : blocks) {
		MetadataBlockInfo block_info;
		block_info.block_id = block.second.block_id;
		block_info.total_blocks = MetadataManager::METADATA_BLOCK_COUNT;
		for (auto free_block : block.second.free_blocks) {
			block_info.free_list.push_back(free_block);
		}
		std::sort(block_info.free_list.begin(), block_info.free_list.end());
		result.push_back(std::move(block_info));
	}
	std::sort(result.begin(), result.end(),
	          [](const MetadataBlockInfo &a, const MetadataBlockInfo &b) { return a.block_id < b.block_id; });
	return result;
}